

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O3

bool __thiscall
cppcms::anon_unknown_0::mounted::dispatch
          (mounted *this,string *url,char *method,application *param_3)

{
  application *paVar1;
  pointer ppVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  bVar4 = option::matches(&this->super_option,url,method);
  if (bVar4) {
    paVar1 = this->app_;
    lVar5 = (long)this->select_;
    if (((lVar5 < 0) ||
        (ppVar2 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3) <=
        this->select_)) || ((long)ppVar2[lVar5].first == -1)) {
      local_38 = local_28;
      local_30 = 0;
      local_28[0] = 0;
    }
    else {
      pcVar3 = (this->super_option).match_.begin_;
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,pcVar3 + ppVar2[lVar5].first,pcVar3 + ppVar2[lVar5].second);
    }
    (*paVar1->_vptr_application[2])(paVar1,&local_38);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return bVar4;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					app_->main(match_[select_]);
					return true;
				}
				return false;
			}